

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

MemoryInit * __thiscall
wasm::Builder::makeMemoryInit
          (Builder *this,Name segment,Expression *dest,Expression *offset,Expression *size,
          Name memory)

{
  MemoryInit *this_00;
  MemoryInit *ret;
  Expression *size_local;
  Expression *offset_local;
  Expression *dest_local;
  Builder *this_local;
  Name segment_local;
  
  segment_local.super_IString.str._M_len = segment.super_IString.str._M_str;
  this_local = segment.super_IString.str._M_len;
  this_00 = MixedArena::alloc<wasm::MemoryInit>(&this->wasm->allocator);
  wasm::Name::operator=(&this_00->segment,(Name *)&this_local);
  this_00->dest = dest;
  this_00->offset = offset;
  this_00->size = size;
  wasm::Name::operator=(&this_00->memory,&memory);
  MemoryInit::finalize(this_00);
  return this_00;
}

Assistant:

MemoryInit* makeMemoryInit(Name segment,
                             Expression* dest,
                             Expression* offset,
                             Expression* size,
                             Name memory) {
    auto* ret = wasm.allocator.alloc<MemoryInit>();
    ret->segment = segment;
    ret->dest = dest;
    ret->offset = offset;
    ret->size = size;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }